

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosout_appender.cpp
# Opt level: O0

void __thiscall miniros::ROSOutAppender::~ROSOutAppender(ROSOutAppender *this)

{
  mutex_type *in_RDI;
  vector<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>,_std::allocator<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_>_>
  *unaff_retaddr;
  scoped_lock<std::mutex> lock;
  scoped_lock<std::mutex> *in_stack_fffffffffffffff0;
  
  (in_RDI->super___mutex_base)._M_mutex.__align = (long)&PTR__ROSOutAppender_0061f200;
  in_RDI[3].super___mutex_base._M_mutex.__size[0x20] = '\x01';
  std::scoped_lock<std::mutex>::scoped_lock(in_stack_fffffffffffffff0,in_RDI);
  std::condition_variable::notify_all();
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x49e69e);
  std::thread::join();
  std::shared_ptr<miniros::TopicManager>::~shared_ptr((shared_ptr<miniros::TopicManager> *)0x49e6c0)
  ;
  std::thread::~thread((thread *)0x49e6d0);
  std::condition_variable::~condition_variable
            ((condition_variable *)&in_RDI[2].super___mutex_base._M_mutex.__data.__list);
  std::
  vector<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>,_std::allocator<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)((in_RDI->super___mutex_base)._M_mutex.__size + 8));
  console::LogAppender::~LogAppender((LogAppender *)in_RDI);
  return;
}

Assistant:

ROSOutAppender::~ROSOutAppender()
{
  shutting_down_ = true;

  {
    std::scoped_lock<std::mutex> lock(queue_mutex_);
    queue_condition_.notify_all();
  }

  publish_thread_.join();
}